

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

int uv__signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum,int oneshot)

{
  byte *pbVar1;
  uint *puVar2;
  uint uVar3;
  uv_signal_t *puVar4;
  uv_signal_s *puVar5;
  int iVar6;
  uv_signal_t *puVar7;
  uv_signal_s *puVar8;
  uv__signal_tree_s *puVar9;
  long lVar10;
  uv_signal_s *puVar11;
  uv_signal_s *puVar12;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar13;
  sigset_t saved_sigmask;
  
  if ((handle->flags & 3) != 0) {
    __assert_fail("!uv__is_closing(handle)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/signal.c"
                  ,0x14e,"int uv__signal_start(uv_signal_t *, uv_signal_cb, int, int)");
  }
  if (signum == 0) {
    return -0x16;
  }
  if (handle->signum == signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }
  uv__signal_block_and_lock(&saved_sigmask);
  puVar7 = uv__signal_first_handle(signum);
  if (puVar7 == (uv_signal_t *)0x0) {
LAB_0011569f:
    iVar6 = uv__signal_register_handler(signum,oneshot);
    if (iVar6 != 0) {
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return iVar6;
    }
    handle->signum = signum;
    if (oneshot == 0) goto LAB_001156cb;
  }
  else {
    if (oneshot == 0) {
      if ((puVar7->flags & 0x2000000) == 0) {
        handle->signum = signum;
        goto LAB_001156cb;
      }
      goto LAB_0011569f;
    }
    handle->signum = signum;
  }
  pbVar1 = (byte *)((long)&handle->flags + 3);
  *pbVar1 = *pbVar1 | 2;
LAB_001156cb:
  iVar6 = 0;
  puVar9 = &uv__signal_tree;
  puVar7 = (uv_signal_t *)0x0;
  while (puVar4 = puVar9->rbh_root, puVar4 != (uv_signal_t *)0x0) {
    iVar6 = uv__signal_compare(handle,puVar4);
    lVar10 = 0x50;
    if ((-1 < iVar6) && (lVar10 = 0x58, iVar6 == 0)) goto LAB_001158fb;
    puVar7 = puVar4;
    puVar9 = (uv__signal_tree_s *)((long)&puVar4->data + lVar10);
  }
  (handle->tree_entry).rbe_parent = puVar7;
  (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
  (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
  (handle->tree_entry).rbe_color = 1;
  puVar9 = &uv__signal_tree;
  if (puVar7 != (uv_signal_t *)0x0) {
    if (iVar6 < 0) {
      puVar9 = (uv__signal_tree_s *)&puVar7->tree_entry;
    }
    else {
      puVar9 = (uv__signal_tree_s *)&(puVar7->tree_entry).rbe_right;
    }
  }
  ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar9)->rbe_left = handle;
  puVar7 = handle;
LAB_00115741:
  do {
    puVar11 = (puVar7->tree_entry).rbe_parent;
    if ((puVar11 == (uv_signal_s *)0x0) || ((puVar11->tree_entry).rbe_color != 1)) {
      ((uv__signal_tree.rbh_root)->tree_entry).rbe_color = 0;
LAB_001158fb:
      uv__signal_unlock_and_unblock(&saved_sigmask);
      handle->signal_cb = signal_cb;
      uVar3 = handle->flags;
      if ((uVar3 & 4) != 0) {
        return 0;
      }
      handle->flags = uVar3 | 4;
      if ((uVar3 & 8) == 0) {
        return 0;
      }
      puVar2 = &handle->loop->active_handles;
      *puVar2 = *puVar2 + 1;
      return 0;
    }
    puVar5 = (puVar11->tree_entry).rbe_parent;
    puVar12 = (puVar5->tree_entry).rbe_left;
    puVar8 = puVar7;
    if (puVar11 == puVar12) {
      puVar12 = (puVar5->tree_entry).rbe_right;
      if ((puVar12 != (uv_signal_s *)0x0) && ((puVar12->tree_entry).rbe_color == 1))
      goto LAB_00115793;
      puVar12 = (puVar11->tree_entry).rbe_right;
      if (puVar12 == puVar7) {
        puVar8 = (puVar12->tree_entry).rbe_left;
        (puVar11->tree_entry).rbe_right = puVar8;
        if (puVar8 == (uv_signal_s *)0x0) {
          (puVar12->tree_entry).rbe_parent = puVar5;
          puVar8 = (puVar11->tree_entry).rbe_parent;
LAB_0011587f:
          puVar9 = (uv__signal_tree_s *)&(puVar8->tree_entry).rbe_right;
          if (puVar11 == (puVar8->tree_entry).rbe_left) {
            puVar9 = (uv__signal_tree_s *)&puVar8->tree_entry;
          }
        }
        else {
          (puVar8->tree_entry).rbe_parent = puVar11;
          puVar8 = (puVar11->tree_entry).rbe_parent;
          (puVar12->tree_entry).rbe_parent = puVar8;
          puVar9 = &uv__signal_tree;
          if (puVar8 != (uv_signal_s *)0x0) goto LAB_0011587f;
        }
        ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar9)->rbe_left = puVar12;
        (puVar12->tree_entry).rbe_left = puVar11;
        (puVar11->tree_entry).rbe_parent = puVar12;
        puVar8 = puVar11;
        puVar11 = puVar7;
      }
      (puVar11->tree_entry).rbe_color = 0;
      (puVar5->tree_entry).rbe_color = 1;
      puVar11 = (puVar5->tree_entry).rbe_left;
      puVar12 = (puVar11->tree_entry).rbe_right;
      (puVar5->tree_entry).rbe_left = puVar12;
      if (puVar12 != (uv_signal_s *)0x0) {
        (puVar12->tree_entry).rbe_parent = puVar5;
      }
      puVar12 = (puVar5->tree_entry).rbe_parent;
      (puVar11->tree_entry).rbe_parent = puVar12;
      paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      if (puVar12 != (uv_signal_s *)0x0) {
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar12->tree_entry).rbe_right;
        if (puVar5 == (puVar12->tree_entry).rbe_left) {
          paVar13 = &puVar12->tree_entry;
        }
      }
      paVar13->rbe_left = puVar11;
      (puVar11->tree_entry).rbe_right = puVar5;
LAB_001158e4:
      (puVar5->tree_entry).rbe_parent = puVar11;
      puVar7 = puVar8;
      goto LAB_00115741;
    }
    if ((puVar12 == (uv_signal_s *)0x0) || ((puVar12->tree_entry).rbe_color != 1)) {
      puVar4 = (puVar11->tree_entry).rbe_left;
      if (puVar4 == puVar7) {
        puVar12 = (puVar4->tree_entry).rbe_right;
        (puVar11->tree_entry).rbe_left = puVar12;
        if (puVar12 == (uv_signal_s *)0x0) {
          (puVar4->tree_entry).rbe_parent = puVar5;
          puVar12 = (puVar11->tree_entry).rbe_parent;
LAB_00115810:
          puVar9 = (uv__signal_tree_s *)&(puVar12->tree_entry).rbe_right;
          if (puVar11 == (puVar12->tree_entry).rbe_left) {
            puVar9 = (uv__signal_tree_s *)&puVar12->tree_entry;
          }
        }
        else {
          (puVar12->tree_entry).rbe_parent = puVar11;
          puVar12 = (puVar11->tree_entry).rbe_parent;
          (puVar4->tree_entry).rbe_parent = puVar12;
          puVar9 = &uv__signal_tree;
          if (puVar12 != (uv_signal_s *)0x0) goto LAB_00115810;
        }
        ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar9)->rbe_left = puVar4;
        (puVar4->tree_entry).rbe_right = puVar11;
        (puVar11->tree_entry).rbe_parent = puVar4;
        puVar8 = puVar11;
        puVar11 = puVar7;
      }
      (puVar11->tree_entry).rbe_color = 0;
      (puVar5->tree_entry).rbe_color = 1;
      puVar11 = (puVar5->tree_entry).rbe_right;
      puVar12 = (puVar11->tree_entry).rbe_left;
      (puVar5->tree_entry).rbe_right = puVar12;
      if (puVar12 != (uv_signal_s *)0x0) {
        (puVar12->tree_entry).rbe_parent = puVar5;
      }
      puVar12 = (puVar5->tree_entry).rbe_parent;
      (puVar11->tree_entry).rbe_parent = puVar12;
      paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      if (puVar12 != (uv_signal_s *)0x0) {
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar12->tree_entry).rbe_right;
        if (puVar5 == (puVar12->tree_entry).rbe_left) {
          paVar13 = &puVar12->tree_entry;
        }
      }
      paVar13->rbe_left = puVar11;
      (puVar11->tree_entry).rbe_left = puVar5;
      goto LAB_001158e4;
    }
LAB_00115793:
    (puVar12->tree_entry).rbe_color = 0;
    (puVar11->tree_entry).rbe_color = 0;
    (puVar5->tree_entry).rbe_color = 1;
    puVar7 = puVar5;
  } while( true );
}

Assistant:

static int uv__signal_start(uv_signal_t* handle,
                            uv_signal_cb signal_cb,
                            int signum,
                            int oneshot) {
  sigset_t saved_sigmask;
  int err;
  uv_signal_t* first_handle;

  assert(!uv__is_closing(handle));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return UV_EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   * Also in case there's only one-shot handlers and a regular handler comes in.
   */
  first_handle = uv__signal_first_handle(signum);
  if (first_handle == NULL ||
      (!oneshot && (first_handle->flags & UV_SIGNAL_ONE_SHOT))) {
    err = uv__signal_register_handler(signum, oneshot);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  if (oneshot)
    handle->flags |= UV_SIGNAL_ONE_SHOT;

  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}